

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseArray.h
# Opt level: O2

void __thiscall
SparseArray<float,_512UL>::insert(SparseArray<float,_512UL> *this,HaU32 key,float *value)

{
  uint uVar1;
  HashEntry *pHVar2;
  HaU32 HVar3;
  HashEntry *next;
  HashEntry *pHVar4;
  
  uVar1 = this->mHashTableCount;
  if (uVar1 < this->mMaxEntries) {
    pHVar4 = this->mFreeList;
    if (pHVar4 == (HashEntry *)0x0) {
      pHVar4 = this->mEntries + uVar1;
      this->mHashTableCount = uVar1 + 1;
      if (this->mMaxEntries <= uVar1 + 1) {
        __assert_fail("mHashTableCount < mMaxEntries",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/SparseArray.h"
                      ,0x95,
                      "void SparseArray<float>::insert(HaU32, const Value &) [Value = float, hashTableSize = 512]"
                     );
      }
    }
    else {
      this->mFreeList = pHVar4->mNext;
      pHVar4->mNext = (HashEntry *)0x0;
    }
    pHVar4->mKey = key;
    pHVar4->mValue = *value;
    HVar3 = getHash(this,key);
    pHVar2 = this->mHashTable[HVar3];
    this->mHashTable[HVar3] = pHVar4;
    if (pHVar2 != (HashEntry *)0x0) {
      pHVar4->mNext = pHVar2;
    }
  }
  return;
}

Assistant:

void insert(HaU32 key, const Value& value)
	{
		if (mHashTableCount < mMaxEntries )
		{
			HashEntry* h;
			if ( mFreeList ) // if there are previously freed hash entry items
			{
				h = mFreeList;
				mFreeList = h->mNext;
				h->mNext = NULL;
			}
			else
			{
				h = &mEntries[mHashTableCount];
				mHashTableCount++;
				HACD_ASSERT( mHashTableCount < mMaxEntries );
			}

			h->mKey = key;
			h->mValue = value;
			HaU32 hash = getHash(key);
			if (mHashTable[hash])
			{
				HashEntry* next = mHashTable[hash];
				mHashTable[hash] = h;
				h->mNext = next;
			}
			else
			{
				mHashTable[hash] = h;
			}
		}
	}